

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType ValueType::Verify(ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  Bits BVar4;
  undefined4 *puVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c [4];
  ValueType valueType_local;
  
  local_c[0] = valueType.field_0;
  bVar2 = operator!((Bits)valueType.field_0);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x69,"(valueType.bits)","valueType.bits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = OneOn((ValueType *)&local_c[0].field_0,Object);
  if ((bVar2) && (OVar3 = GetObjectType((ValueType *)&local_c[0].field_0), CharArray < OVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x6a,
                       "(!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count)"
                       ,
                       "!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = OneOn((ValueType *)&local_c[0].field_0,Object);
  if ((!bVar2) && (bVar2 = OneOn((ValueType *)&local_c[0].field_0,Int), !bVar2)) {
    BVar4 = operator|(IntCanBeUntagged,IntIsLikelyUntagged);
    bVar2 = AnyOnExcept((ValueType *)&local_c[0].field_0,BVar4);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e,
                         "(valueType.OneOn(Bits::Object) || valueType.OneOn(Bits::Int) || valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged))"
                         ,
                         "valueType.OneOn(Bits::Object) || valueType.OneOn(Bits::Int) || valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  bVar2 = OneOn((ValueType *)&local_c[0].field_0,Object);
  if (!bVar2) {
    BVar4 = operator|(IntCanBeUntagged,IntIsLikelyUntagged);
    bVar2 = AllEqual((ValueType *)&local_c[0].field_0,BVar4,IntIsLikelyUntagged);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x71,
                         "(valueType.OneOn(Bits::Object) || !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged))"
                         ,
                         "valueType.OneOn(Bits::Object) || !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)local_c[0].field_0;
}

Assistant:

ValueType ValueType::Verify(const ValueType valueType)
{
    Assert(valueType.bits);
    Assert(!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count);
    Assert(
        valueType.OneOn(Bits::Object) ||
        valueType.OneOn(Bits::Int) ||
        valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged));
    Assert(
        valueType.OneOn(Bits::Object) ||
        !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged));

    return valueType;
}